

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_triggering_spells(textblock *tb,player_shape *s)

{
  class_spell_conflict *pcVar1;
  class_book_conflict *pcVar2;
  object_kind *poVar3;
  effect *local_58;
  effect *effect;
  class_spell *spell;
  wchar_t ispell;
  object_kind *kind;
  class_book *book;
  player_class *ppStack_28;
  wchar_t ibook;
  player_class *c;
  wchar_t n;
  player_shape *s_local;
  textblock *tb_local;
  
  c._4_4_ = 0;
  for (ppStack_28 = classes; ppStack_28 != (player_class *)0x0; ppStack_28 = ppStack_28->next) {
    for (book._4_4_ = 0; book._4_4_ < (ppStack_28->magic).num_books; book._4_4_ = book._4_4_ + 1) {
      pcVar2 = (ppStack_28->magic).books + book._4_4_;
      poVar3 = lookup_kind(pcVar2->tval,pcVar2->sval);
      if ((poVar3 != (object_kind *)0x0) && (poVar3->name != (char *)0x0)) {
        for (spell._4_4_ = 0; spell._4_4_ < pcVar2->num_spells; spell._4_4_ = spell._4_4_ + 1) {
          pcVar1 = pcVar2->spells;
          for (local_58 = pcVar1[spell._4_4_].effect; local_58 != (effect *)0x0;
              local_58 = local_58->next) {
            if ((local_58->index == 0x6b) && (local_58->subtype == s->sidx)) {
              if (c._4_4_ == 0) {
                textblock_append(tb,"\n");
              }
              textblock_append(tb,"The %s spell, %s, from %s triggers the shapechange.",
                               ppStack_28->name,pcVar1[spell._4_4_].name,poVar3->name);
              c._4_4_ = c._4_4_ + 1;
            }
          }
        }
      }
    }
  }
  if (0 < c._4_4_) {
    textblock_append(tb,"\n");
  }
  return;
}

Assistant:

static void shape_lore_append_triggering_spells(textblock *tb,
	const struct player_shape *s)
{
	int n = 0;
	struct player_class *c;

	for (c = classes; c; c = c->next) {
		int ibook;

		for (ibook = 0; ibook < c->magic.num_books; ++ibook) {
			const struct class_book *book = c->magic.books + ibook;
			const struct object_kind *kind =
				lookup_kind(book->tval, book->sval);
			int ispell;

			if (!kind || !kind->name) {
				continue;
			}
			for (ispell = 0; ispell < book->num_spells; ++ispell) {
				const struct class_spell *spell =
					book->spells + ispell;
				const struct effect *effect;

				for (effect = spell->effect;
					effect;
					effect = effect->next) {
					if (effect->index == EF_SHAPECHANGE &&
						effect->subtype == s->sidx) {
						if (n == 0) {
							textblock_append(tb, "\n");
						}
						textblock_append(tb,
							"The %s spell, %s, from %s triggers the shapechange.",
							c->name,
							spell->name,
							kind->name
						);
						++n;
					}
				}
			}
		}
	}

	if (n > 0) {
		textblock_append(tb, "\n");
	}
}